

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildLdSpreadIndices(IRBuilder *this,uint32 offset,uint32 spreadAuxOffset)

{
  ArgSlot AVar1;
  AddrOpnd *newSrc;
  Instr *this_00;
  Type *ppIVar2;
  SymOpnd *pSVar3;
  StackSym *pSVar4;
  Instr *local_30;
  Instr *instr;
  
  newSrc = BuildAuxArrayOpnd(this,AuxIntArray,spreadAuxOffset);
  this_00 = IR::Instr::New(LdSpreadIndices,this->m_func);
  local_30 = this_00;
  IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
  ppIVar2 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->m_argStack->
                        super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  pSVar3 = IR::Opnd::AsSymOpnd((*ppIVar2)->m_dst);
  pSVar4 = IR::Opnd::GetStackSym(&pSVar3->super_Opnd);
  AVar1 = StackSym::GetArgSlotNum(pSVar4);
  pSVar4 = SymTable::GetArgSlotSym(this->m_func->m_symTable,AVar1 + 1);
  pSVar3 = IR::SymOpnd::New(&pSVar4->super_Sym,TyVar,this->m_func);
  IR::Instr::SetDst(this_00,&pSVar3->super_Opnd);
  AddInstr(this,this_00,0xffffffff);
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend(this->m_argStack,&local_30);
  return;
}

Assistant:

void IRBuilder::BuildLdSpreadIndices(uint32 offset, uint32 spreadAuxOffset)
{
    // Link up the LdSpreadIndices instr to be the first in the arg chain. This will allow us to find it in Lowerer easier.
    IR::Opnd *auxArg = this->BuildAuxArrayOpnd(AuxArrayValue::AuxIntArray, spreadAuxOffset);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::LdSpreadIndices, m_func);
    instr->SetSrc1(auxArg);

    // Create the link to the first arg.
    Js::RegSlot lastArg = m_argStack->Head()->GetDst()->AsSymOpnd()->GetStackSym()->GetArgSlotNum();
    instr->SetDst(IR::SymOpnd::New(m_func->m_symTable->GetArgSlotSym((uint16) (lastArg + 1)), TyVar, m_func));
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    m_argStack->Push(instr);
}